

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O1

int Sbd_StoPrepareSet(Sbd_Sto_t *p,int iObj,int Index)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Sbd_Cut_t *pSVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  
  if ((iObj < 0) || (p->vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  piVar3 = p->vCuts->pArray[(uint)iObj].pArray;
  iVar6 = *piVar3;
  if (0 < iVar6) {
    piVar9 = piVar3 + 1;
    piVar7 = p->pCuts[(uint)Index][0].pLeaves;
    lVar14 = 0;
    do {
      *(uint *)&p->pCuts[(uint)Index][lVar14].field_0x14 =
           *(uint *)&p->pCuts[(uint)Index][lVar14].field_0x14 & 0xfffffff | *piVar9 << 0x1c;
      iVar6 = *piVar9;
      if (0 < iVar6) {
        lVar8 = 0;
        do {
          piVar7[lVar8] = piVar9[lVar8 + 1];
          iVar6 = *piVar9;
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar6);
      }
      pSVar5 = p->pCuts[(uint)Index] + lVar14;
      pSVar5->iFunc = piVar9[(long)iVar6 + 1];
      uVar1 = *(uint *)&pSVar5->field_0x14;
      if (uVar1 < 0x10000000) {
        pSVar5->Sign = 0;
        iVar6 = 0;
LAB_005412c2:
        pSVar5->Cost = iVar6;
        if (0xfffffff < uVar1) {
          uVar11 = 0;
          iVar6 = 0;
          do {
            iVar2 = piVar7[uVar11];
            if (((long)iVar2 < 0) || (p->vLevels->nSize <= iVar2)) goto LAB_005414b3;
            iVar6 = iVar6 + p->vLevels->pArray[iVar2];
            uVar11 = uVar11 + 1;
          } while (uVar1 >> 0x1c != uVar11);
          goto LAB_00541314;
        }
        pSVar5->CostLev = 0;
        uVar15 = 0;
      }
      else {
        uVar10 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 | 1L << ((ulong)(byte)piVar7[uVar10] & 0x3f);
          uVar10 = uVar10 + 1;
        } while (uVar1 >> 0x1c != uVar10);
        pSVar5->Sign = uVar11;
        if (0xfffffff < uVar1) {
          uVar11 = 0;
          iVar6 = 0;
          do {
            iVar2 = piVar7[uVar11];
            if (((long)iVar2 < 0) || (p->vDelays->nSize <= iVar2)) goto LAB_005414b3;
            iVar6 = iVar6 + p->vDelays->pArray[iVar2];
            uVar11 = uVar11 + 1;
          } while (uVar1 >> 0x1c != uVar11);
          goto LAB_005412c2;
        }
        pSVar5->Cost = 0;
        iVar6 = 0;
LAB_00541314:
        uVar15 = 0;
        pSVar5->CostLev = iVar6;
        if (0xfffffff < uVar1) {
          uVar11 = 0;
          uVar15 = 0;
          do {
            iVar6 = piVar7[uVar11];
            if (((long)iVar6 < 0) || (p->vRefs->nSize <= iVar6)) goto LAB_005414b3;
            uVar15 = uVar15 + (p->vRefs->pArray[iVar6] == 1);
            uVar11 = uVar11 + 1;
          } while (uVar1 >> 0x1c != uVar11);
          uVar15 = uVar15 & 0x1ff;
        }
      }
      *(uint *)&pSVar5->field_0x14 = uVar1 & 0xfffffe00 | uVar15;
      pVVar4 = p->vDelays;
      if (pVVar4->nSize <= iObj) {
LAB_005414b3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar12 = 0;
      if (0xfffffff < uVar1) {
        uVar11 = 0;
        uVar12 = 0;
        do {
          iVar6 = piVar7[uVar11];
          if (((long)iVar6 < 0) || (pVVar4->nSize <= iVar6)) goto LAB_005414b3;
          uVar12 = uVar12 + (-2 < pVVar4->pArray[iVar6] - pVVar4->pArray[(uint)iObj]);
          uVar11 = uVar11 + 1;
        } while (uVar1 >> 0x1c != uVar11);
        uVar12 = (uVar12 & 0x1ff) << 9;
      }
      *(uint *)&pSVar5->field_0x14 = uVar1 & 0xfffc0000 | uVar15 | uVar12;
      if (pVVar4->nSize <= iObj) goto LAB_005414b3;
      uVar13 = 0;
      if (0xfffffff < uVar1) {
        uVar11 = 0;
        uVar13 = 0;
        do {
          iVar6 = piVar7[uVar11];
          if (((long)iVar6 < 0) || (pVVar4->nSize <= iVar6)) goto LAB_005414b3;
          uVar13 = uVar13 + (pVVar4->pArray[iVar6] - pVVar4->pArray[(uint)iObj] == -2);
          uVar11 = uVar11 + 1;
        } while (uVar1 >> 0x1c != uVar11);
        uVar13 = (uVar13 & 0x3ff) << 0x12;
      }
      *(uint *)&pSVar5->field_0x14 = uVar1 & 0xf0000000 | uVar15 | uVar12 | uVar13;
      lVar14 = lVar14 + 1;
      piVar9 = piVar9 + (long)*piVar9 + 2;
      iVar6 = *piVar3;
      piVar7 = piVar7 + 0x10;
    } while (lVar14 < iVar6);
  }
  return iVar6;
}

Assistant:

static inline int Sbd_StoPrepareSet( Sbd_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sbd_ForEachCut( pList, pCut, i )
    {
        Sbd_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sbd_CutGetSign( pCutTemp );
        pCutTemp->Cost = Sbd_CutCost( p, pCutTemp );
        pCutTemp->CostLev = Sbd_CutCostLev( p, pCutTemp );
        pCutTemp->nTreeLeaves = Sbd_CutTreeLeaves( p, pCutTemp );
        pCutTemp->nSlowLeaves = Sbd_CutSlowLeaves( p, iObj, pCutTemp );
        pCutTemp->nTopLeaves  = Sbd_CutTopLeaves( p, iObj, pCutTemp );
    }
    return pList[0];
}